

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# matmul_x86_avx.cpp
# Opt level: O2

int __thiscall ncnn::MatMul_x86_avx::destroy_pipeline(MatMul_x86_avx *this,Option *opt)

{
  if (this->gemm != (Layer *)0x0) {
    (*this->gemm->_vptr_Layer[5])();
    if (this->gemm != (Layer *)0x0) {
      (*this->gemm->_vptr_Layer[1])();
    }
    this->gemm = (Layer *)0x0;
  }
  return 0;
}

Assistant:

int MatMul_x86_avx::destroy_pipeline(const Option& opt)
{
    if (gemm)
    {
        gemm->destroy_pipeline(opt);
        delete gemm;
        gemm = 0;
    }

    return 0;
}